

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

int __thiscall QAbstractItemView::sizeHintForRow(QAbstractItemView *this,int row)

{
  bool bVar1;
  int iVar2;
  QAbstractItemViewPrivate *pQVar3;
  QWidget *pQVar4;
  int *piVar5;
  long *plVar6;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemDelegate *delegate;
  QWidget *editor;
  int c;
  int colCount;
  QAbstractItemViewPrivate *d;
  QModelIndex index;
  int height;
  QStyleOptionViewItem option;
  QStyleOptionViewItem *in_stack_fffffffffffffe40;
  QModelIndex *index_00;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe58;
  int local_178;
  int local_154;
  int local_148;
  int local_144;
  QPersistentModelIndex local_140 [3];
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  QPersistentModelIndex local_110 [3];
  int local_f4;
  QPersistentModelIndex local_f0 [3];
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QAbstractItemView *)0x80c4c4);
  bVar1 = true;
  if (-1 < in_ESI) {
    in_stack_fffffffffffffe58 = (QAbstractItemViewPrivate *)pQVar3->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_f0);
    iVar2 = (**(code **)(*(long *)&(in_stack_fffffffffffffe58->super_QAbstractScrollAreaPrivate).
                                   super_QFramePrivate.super_QWidgetPrivate + 0x78))
                      (in_stack_fffffffffffffe58,local_f0);
    bVar1 = iVar2 <= in_ESI;
  }
  if (bVar1) {
    local_154 = -1;
  }
  else {
    QWidget::ensurePolished(in_RDI);
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x80c56f);
    (**(code **)(*(long *)in_RDI + 0x2f8))(in_RDI,local_d8);
    local_f4 = 0;
    index_00 = (QModelIndex *)pQVar3->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_110);
    iVar2 = (**(code **)(*(long *)index_00 + 0x80))(index_00,local_110);
    for (local_178 = 0; local_178 < iVar2; local_178 = local_178 + 1) {
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      local_120 = &DAT_aaaaaaaaaaaaaaaa;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffe40 = (QStyleOptionViewItem *)pQVar3->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_140);
      (**(code **)(*(long *)&in_stack_fffffffffffffe40->super_QStyleOption + 0x60))
                (&local_128,in_stack_fffffffffffffe40,in_ESI,local_178,local_140);
      QAbstractItemViewPrivate::editorForIndex(in_stack_fffffffffffffe58,index_00);
      pQVar4 = QPointer<QWidget>::data((QPointer<QWidget> *)0x80c68e);
      if (pQVar4 != (QWidget *)0x0) {
        local_144 = QWidget::height((QWidget *)0x80c6a5);
        piVar5 = qMax<int>(&local_f4,&local_144);
        local_f4 = *piVar5;
      }
      plVar6 = (long *)(**(code **)(*(long *)in_RDI + 0x208))(in_RDI,&local_128);
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 0x68))(plVar6,local_d8,&local_128);
        local_148 = QSize::height((QSize *)0x80c717);
        piVar5 = qMax<int>(&local_f4,&local_148);
        local_f4 = *piVar5;
      }
    }
    local_154 = local_f4;
    QStyleOptionViewItem::~QStyleOptionViewItem(in_stack_fffffffffffffe40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_154;
  }
  __stack_chk_fail();
}

Assistant:

int QAbstractItemView::sizeHintForRow(int row) const
{
    Q_D(const QAbstractItemView);

    if (row < 0 || row >= d->model->rowCount(d->root))
        return -1;

    ensurePolished();

    QStyleOptionViewItem option;
    initViewItemOption(&option);
    int height = 0;
    int colCount = d->model->columnCount(d->root);
    for (int c = 0; c < colCount; ++c) {
        const QModelIndex index = d->model->index(row, c, d->root);
        if (QWidget *editor = d->editorForIndex(index).widget.data())
            height = qMax(height, editor->height());
        if (const QAbstractItemDelegate *delegate = itemDelegateForIndex(index))
            height = qMax(height, delegate->sizeHint(option, index).height());
    }
    return height;
}